

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O0

void alcGetIntegerv(ALCdevice *device,ALCenum param,ALCsizei size,ALCint *values)

{
  pointer in_RCX;
  uint in_EDX;
  ALCdevice *in_stack_00000008;
  DeviceRef dev;
  ALCenum in_stack_000002c4;
  ALCdevice *in_stack_000002c8;
  span<int,_18446744073709551615UL> in_stack_000002d0;
  ALCdevice *in_stack_ffffffffffffffb0;
  ALCenum in_stack_ffffffffffffffcc;
  ALCdevice *in_stack_ffffffffffffffd0;
  intrusive_ptr<ALCdevice> local_20;
  pointer local_18;
  uint local_10;
  
  local_18 = in_RCX;
  local_10 = in_EDX;
  VerifyDevice(in_stack_00000008);
  if (((int)local_10 < 1) || (local_18 == (pointer)0x0)) {
    al::intrusive_ptr<ALCdevice>::get(&local_20);
    alcSetError(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  else {
    in_stack_ffffffffffffffb0 = al::intrusive_ptr<ALCdevice>::get(&local_20);
    al::span<int,_18446744073709551615UL>::span
              ((span<int,_18446744073709551615UL> *)&stack0xffffffffffffffc0,local_18,
               (ulong)local_10);
    GetIntegerv(in_stack_000002c8,in_stack_000002c4,in_stack_000002d0);
  }
  al::intrusive_ptr<ALCdevice>::~intrusive_ptr
            ((intrusive_ptr<ALCdevice> *)in_stack_ffffffffffffffb0);
  return;
}

Assistant:

ALC_API void ALC_APIENTRY alcGetIntegerv(ALCdevice *device, ALCenum param, ALCsizei size, ALCint *values)
START_API_FUNC
{
    DeviceRef dev{VerifyDevice(device)};
    if(size <= 0 || values == nullptr)
        alcSetError(dev.get(), ALC_INVALID_VALUE);
    else
        GetIntegerv(dev.get(), param, {values, static_cast<ALuint>(size)});
}